

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  AssemblyGeneratorX86 asmX86;
  Blake2Generator gen;
  SuperscalarProgram p;
  int nonce;
  bool genSuperscalar;
  bool genNative;
  bool genAsm;
  bool softAes;
  uint32_t in_stack_0001f074;
  uint32_t in_stack_0001f234;
  bool *in_stack_ffffffffffffed68;
  ostream *os;
  char **in_stack_ffffffffffffed70;
  AssemblyGeneratorX86 *this;
  undefined8 in_stack_ffffffffffffed78;
  int argc_00;
  char *in_stack_ffffffffffffed80;
  void *in_stack_ffffffffffffed88;
  Blake2Generator *in_stack_ffffffffffffed90;
  SuperscalarProgram *in_stack_ffffffffffffee08;
  AssemblyGeneratorX86 *in_stack_ffffffffffffee10;
  ostream local_10c8 [2032];
  Blake2Generator *in_stack_fffffffffffff728;
  SuperscalarProgram *in_stack_fffffffffffff730;
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  
  argc_00 = (int)((ulong)in_stack_ffffffffffffed78 >> 0x20);
  readOption(in_stack_ffffffffffffed80,argc_00,in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
  readOption(in_stack_ffffffffffffed80,argc_00,in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
  readIntOption(in_stack_ffffffffffffed80,argc_00,in_stack_ffffffffffffed70,
                (int *)in_stack_ffffffffffffed68,0);
  readOption(in_stack_ffffffffffffed80,argc_00,in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
  readOption(in_stack_ffffffffffffed80,argc_00,in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
  if ((local_14 & 1) == 0) {
    if ((local_12 & 1) == 0) {
      if ((local_13 & 1) == 0) {
        printUsage((char *)0x10e34c);
      }
      else if ((local_11 & 1) == 0) {
        generateNative<false>(in_stack_0001f074);
      }
      else {
        generateNative<true>(in_stack_0001f074);
      }
    }
    else if ((local_11 & 1) == 0) {
      generateAsm<false>(in_stack_0001f234);
    }
    else {
      generateAsm<true>(in_stack_0001f234);
    }
  }
  else {
    os = local_10c8;
    randomx::Blake2Generator::Blake2Generator
              (in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,(size_t)in_stack_ffffffffffffed80
               ,argc_00);
    randomx::generateSuperscalar(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
    this = (AssemblyGeneratorX86 *)&stack0xffffffffffffed90;
    randomx::AssemblyGeneratorX86::AssemblyGeneratorX86((AssemblyGeneratorX86 *)0x10e26b);
    randomx::AssemblyGeneratorX86::generateAsm(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
    randomx::AssemblyGeneratorX86::printCode(this,os);
    randomx::AssemblyGeneratorX86::~AssemblyGeneratorX86((AssemblyGeneratorX86 *)0x10e2a4);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, genAsm, genNative, genSuperscalar;
	int nonce;

	readOption("--softAes", argc, argv, softAes);
	readOption("--genAsm", argc, argv, genAsm);
	readIntOption("--nonce", argc, argv, nonce, 1000);
	readOption("--genNative", argc, argv, genNative);
	readOption("--genSuperscalar", argc, argv, genSuperscalar);

	if (genSuperscalar) {
		randomx::SuperscalarProgram p;
		randomx::Blake2Generator gen(seed, nonce);
		randomx::generateSuperscalar(p, gen);
		randomx::AssemblyGeneratorX86 asmX86;
		asmX86.generateAsm(p);
		asmX86.printCode(std::cout);
		return 0;
	}

	if (genAsm) {
		if (softAes)
			generateAsm<true>(nonce);
		else
			generateAsm<false>(nonce);
		return 0;
	}

	if (genNative) {
		if (softAes)
			generateNative<true>(nonce);
		else
			generateNative<false>(nonce);
		return 0;
	}

	printUsage(argv[0]);
	return 0;
}